

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Combine<duckdb::ArgMinMaxState<double,long>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  ArgMinMaxState<double,_long> *source_00;
  ArgMinMaxState<double,_long> *in_RCX;
  idx_t i;
  ArgMinMaxState<double,_long> **tdata;
  ArgMinMaxState<double,_long> **sdata;
  ArgMinMaxState<double,_long> *target_00;
  
  FlatVector::GetData<duckdb::ArgMinMaxState<double,long>const*>((Vector *)0x1b77dc2);
  source_00 = (ArgMinMaxState<double,_long> *)
              FlatVector::GetData<duckdb::ArgMinMaxState<double,long>*>((Vector *)0x1b77dd1);
  for (target_00 = (ArgMinMaxState<double,_long> *)0x0; target_00 < in_RCX;
      target_00 = (ArgMinMaxState<double,_long> *)&(target_00->super_ArgMinMaxStateBase).arg_null) {
    ArgMinMaxBase<duckdb::LessThan,true>::
    Combine<duckdb::ArgMinMaxState<double,long>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
              (source_00,target_00,(AggregateInputData *)0x1b77e0d);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}